

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockedpool.cpp
# Opt level: O3

void __thiscall PosixLockedPageAllocator::PosixLockedPageAllocator(PosixLockedPageAllocator *this)

{
  long lVar1;
  size_t sVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  (this->super_LockedPageAllocator)._vptr_LockedPageAllocator =
       (_func_int **)&PTR__LockedPageAllocator_006c07b8;
  sVar2 = sysconf(0x1e);
  this->page_size = sVar2;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

PosixLockedPageAllocator::PosixLockedPageAllocator()
{
    // Determine system page size in bytes
#if defined(PAGESIZE) // defined in limits.h
    page_size = PAGESIZE;
#else                   // assume some POSIX OS
    page_size = sysconf(_SC_PAGESIZE);
#endif
}